

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.c
# Opt level: O0

int pub0_sock_get_sendbuf(void *arg,void *buf,size_t *szp,nni_type t)

{
  undefined8 uVar1;
  int iVar2;
  int val;
  pub0_sock *sock;
  nni_type t_local;
  size_t *szp_local;
  void *buf_local;
  void *arg_local;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x18));
  uVar1 = *(undefined8 *)((long)arg + 0x48);
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x18));
  iVar2 = nni_copyout_int((int)uVar1,buf,szp,t);
  return iVar2;
}

Assistant:

static int
pub0_sock_get_sendbuf(void *arg, void *buf, size_t *szp, nni_type t)
{
	pub0_sock *sock = arg;
	int        val;
	nni_mtx_lock(&sock->mtx);
	val = (int) sock->sendbuf;
	nni_mtx_unlock(&sock->mtx);
	return (nni_copyout_int(val, buf, szp, t));
}